

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O2

void __thiscall ProblemTest_AddObj_Test::TestBody(ProblemTest_AddObj_Test *this)

{
  pointer pBVar1;
  pointer pLVar2;
  Type TVar3;
  NumericConstant expr;
  LinearObjBuilder this_00;
  Type *actual;
  char *pcVar4;
  char *in_R9;
  AssertHelperData *pAVar5;
  internal *this_01;
  int i;
  long lVar6;
  MutObjective MVar7;
  int indices [2];
  AssertionResult gtest_ar_;
  AssertHelper local_3d8;
  AssertHelper local_3d0;
  BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  local_3c8;
  double coefs [2];
  AssertHelper local_398;
  int num_terms;
  Problem p;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(&p);
  local_3c8.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_ =
       (BasicProblem<mp::BasicProblemParams<int>_> *)
       ((ulong)local_3c8.
               super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
               problem_._4_4_ << 0x20);
  gtest_ar_._0_4_ =
       SUB84(((long)p.linear_objs_.
                    super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)p.linear_objs_.
                   super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x78,0);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)coefs,"0","p.num_objs()",(int *)&local_3c8,(int *)&gtest_ar_);
  if (coefs[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_3c8);
    if (coefs[1] == 0.0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)coefs[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0xbc,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(coefs + 1));
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddObj(&p,MIN,0);
  local_3c8.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_ =
       (BasicProblem<mp::BasicProblemParams<int>_> *)
       CONCAT44(local_3c8.
                super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
                problem_._4_4_,1);
  gtest_ar_._0_4_ =
       SUB84(((long)p.linear_objs_.
                    super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)p.linear_objs_.
                   super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x78,0);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)coefs,"1","p.num_objs()",(int *)&local_3c8,(int *)&gtest_ar_);
  if (coefs[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_3c8);
    if (coefs[1] == 0.0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)coefs[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0xbf,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(coefs + 1));
  MVar7 = mp::BasicProblem<mp::BasicProblemParams<int>_>::obj(&p,0);
  local_3c8.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_ =
       MVar7.
       super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_3c8.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ =
       MVar7.
       super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  gtest_ar_.success_ = false;
  gtest_ar_._1_3_ = 0;
  indices[0] = mp::BasicProblem<mp::BasicProblemParams<int>_>::
               BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
               ::type(&local_3c8);
  testing::internal::CmpHelperEQ<mp::obj::Type,mp::obj::Type>
            ((internal *)coefs,"mp::obj::MIN","obj.type()",(Type *)&gtest_ar_,(Type *)indices);
  if (coefs[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (coefs[1] == 0.0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)coefs[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)indices,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0xc1,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)indices,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)indices);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(coefs + 1));
  pBVar1 = ((local_3c8.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
            .problem_)->nonlinear_objs_).
           super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(long)local_3c8.
                   super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
                   index_ <
      (ulong)((long)((local_3c8.
                      super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
                     problem_)->nonlinear_objs_).
                    super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 3)) {
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar_.success_ =
         pBVar1[local_3c8.
                super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_
               ].super_ExprBase.impl_ == (Impl *)0x0;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)indices);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)coefs,(internal *)&gtest_ar_,(AssertionResult *)"!obj.nonlinear_expr()",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_3d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
                 0xc2,(char *)coefs[0]);
      testing::internal::AssertHelper::operator=(&local_3d8,(Message *)indices);
      testing::internal::AssertHelper::~AssertHelper(&local_3d8);
      std::__cxx11::string::~string((string *)coefs);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)indices);
    }
  }
  else {
    gtest_ar_.success_ = true;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = false;
  gtest_ar_._1_3_ = 0;
  indices[0] = *(int *)((long)&((local_3c8.
                                 super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                                .problem_)->linear_objs_).
                               super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>.
                               _M_impl.super__Vector_impl_data._M_start
                               [local_3c8.
                                super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                                .index_].terms_.
                               super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> +
                       0x10);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)coefs,"0","obj.linear_expr().num_terms()",(int *)&gtest_ar_,indices);
  if (coefs[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (coefs[1] == 0.0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)coefs[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)indices,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0xc3,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)indices,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)indices);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(coefs + 1));
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddObj(&p,MAX,(NumericExpr)0x0,0);
  gtest_ar_.success_ = true;
  gtest_ar_._1_3_ = 0;
  indices[0] = (int)(((long)p.linear_objs_.
                            super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)p.linear_objs_.
                           super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>.
                           _M_impl.super__Vector_impl_data._M_start) / 0x78);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)coefs,"2","p.num_objs()",(int *)&gtest_ar_,indices);
  if (coefs[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (coefs[1] == 0.0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)coefs[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)indices,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0xc6,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)indices,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)indices);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(coefs + 1));
  MVar7 = mp::BasicProblem<mp::BasicProblemParams<int>_>::obj(&p,1);
  local_3c8.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_ =
       MVar7.
       super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_3c8.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ =
       MVar7.
       super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  gtest_ar_.success_ = true;
  gtest_ar_._1_3_ = 0;
  TVar3 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
          BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          ::type(&local_3c8);
  indices[0] = TVar3;
  testing::internal::CmpHelperEQ<mp::obj::Type,mp::obj::Type>
            ((internal *)coefs,"mp::obj::MAX","obj.type()",(Type *)&gtest_ar_,(Type *)indices);
  if (coefs[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (coefs[1] == 0.0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)coefs[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)indices,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               200,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)indices,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)indices);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(coefs + 1));
  pBVar1 = ((local_3c8.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
            .problem_)->nonlinear_objs_).
           super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(long)local_3c8.
                   super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
                   index_ <
      (ulong)((long)((local_3c8.
                      super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
                     problem_)->nonlinear_objs_).
                    super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 3)) {
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar_.success_ =
         pBVar1[local_3c8.
                super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_
               ].super_ExprBase.impl_ == (Impl *)0x0;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)indices);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)coefs,(internal *)&gtest_ar_,(AssertionResult *)"!obj.nonlinear_expr()",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_3d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
                 0xc9,(char *)coefs[0]);
      testing::internal::AssertHelper::operator=(&local_3d8,(Message *)indices);
      testing::internal::AssertHelper::~AssertHelper(&local_3d8);
      std::__cxx11::string::~string((string *)coefs);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)indices);
    }
  }
  else {
    gtest_ar_.success_ = true;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = false;
  gtest_ar_._1_3_ = 0;
  indices[0] = *(int *)((long)&((local_3c8.
                                 super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                                .problem_)->linear_objs_).
                               super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>.
                               _M_impl.super__Vector_impl_data._M_start
                               [local_3c8.
                                super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                                .index_].terms_.
                               super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> +
                       0x10);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)coefs,"0","obj.linear_expr().num_terms()",(int *)&gtest_ar_,indices);
  if (coefs[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (coefs[1] == 0.0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)coefs[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)indices,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0xca,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)indices,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)indices);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(coefs + 1));
  expr = mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant(&p.super_ExprFactory,42.0)
  ;
  this_00 = mp::BasicProblem<mp::BasicProblemParams<int>_>::AddObj
                      (&p,MIN,(NumericExpr)
                              expr.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.
                              super_ExprBase.impl_,0);
  mp::LinearExpr::AddTerm(this_00.expr_,0,1.1);
  mp::LinearExpr::AddTerm(this_00.expr_,3,2.2);
  gtest_ar_.success_ = true;
  gtest_ar_._1_3_ = 0;
  indices[0] = (int)(((long)p.linear_objs_.
                            super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)p.linear_objs_.
                           super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>.
                           _M_impl.super__Vector_impl_data._M_start) / 0x78);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)coefs,"3","p.num_objs()",(int *)&gtest_ar_,indices);
  if (coefs[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (coefs[1] == 0.0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)coefs[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)indices,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0xd0,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)indices,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)indices);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(coefs + 1));
  MVar7 = mp::BasicProblem<mp::BasicProblemParams<int>_>::obj(&p,2);
  local_3c8.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_ =
       MVar7.
       super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_3c8.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ =
       MVar7.
       super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  gtest_ar_.success_ = false;
  gtest_ar_._1_3_ = 0;
  TVar3 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
          BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          ::type(&local_3c8);
  actual = (Type *)indices;
  indices[0] = TVar3;
  this_01 = (internal *)coefs;
  testing::internal::CmpHelperEQ<mp::obj::Type,mp::obj::Type>
            (this_01,"mp::obj::MIN","obj.type()",(Type *)&gtest_ar_,actual);
  if (coefs[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (coefs[1] == 0.0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)coefs[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)indices,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0xd2,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)indices,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)indices);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(coefs + 1));
  indices[0] = 0;
  indices[1] = 3;
  coefs[0] = 1.1;
  coefs[1] = 2.2;
  num_terms = 2;
  local_3d8.data_._0_4_ =
       *(undefined4 *)
        ((long)&((local_3c8.
                  super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
                 problem_)->linear_objs_).
                super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
                super__Vector_impl_data._M_start
                [local_3c8.
                 super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
                 index_].terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> +
        0x10);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_,"num_terms","obj.linear_expr().num_terms()",&num_terms,
             (int *)&local_3d8);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_3d8);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0xd5,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)&local_3d8);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  pAVar5 = *(AssertHelperData **)
            &((local_3c8.
               super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              problem_)->linear_objs_).
             super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
             super__Vector_impl_data._M_start
             [local_3c8.
              super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_].
             terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>;
  for (lVar6 = 0; local_3d8.data_ = pAVar5, lVar6 < num_terms; lVar6 = lVar6 + 1) {
    local_3d0.data_._0_4_ = pAVar5->type;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar_,"indices[i]","it->var_index()",(int *)actual,(int *)&local_3d0
              );
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&local_3d0);
      pcVar4 = "";
      if (gtest_ar_.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_398,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
                 0xd5,pcVar4);
      testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3d0);
      testing::internal::AssertHelper::~AssertHelper(&local_398);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_3d0);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    local_3d0.data_ = (AssertHelperData *)pAVar5->file;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&gtest_ar_,"coefs[i]","it->coef()",(double *)this_01,(double *)&local_3d0
              );
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&local_3d0);
      pcVar4 = "";
      if (gtest_ar_.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_398,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
                 0xd5,pcVar4);
      testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3d0);
      testing::internal::AssertHelper::~AssertHelper(&local_398);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_3d0);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    pAVar5 = (AssertHelperData *)&pAVar5->line;
    this_01 = this_01 + 8;
    actual = actual + 1;
  }
  pLVar2 = ((local_3c8.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
            .problem_)->linear_objs_).
           super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_3d0.data_ =
       (AssertHelperData *)
       (*(size_ty *)
         ((long)&pLVar2[local_3c8.
                        super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                        .index_].terms_.
                 super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> + 0x10) * 0x10 +
       *(long *)&pLVar2[local_3c8.
                        super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                        .index_].terms_.
                 super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>);
  testing::internal::
  CmpHelperEQ<gch::small_vector_iterator<mp::LinearExpr::Term_const*,long>,gch::small_vector_iterator<mp::LinearExpr::Term_const*,long>>
            ((internal *)&gtest_ar_,"obj.linear_expr().end()","it",
             (small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)&local_3d0,
             (small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)&local_3d8);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_3d0);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0xd5,pcVar4);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(&p);
  return;
}

Assistant:

TEST(ProblemTest, AddObj) {
  Problem p;
  EXPECT_EQ(0, p.num_objs());

  p.AddObj(mp::obj::MIN);
  EXPECT_EQ(1, p.num_objs());
  Problem::Objective obj = p.obj(0);
  EXPECT_EQ(mp::obj::MIN, obj.type());
  EXPECT_TRUE(!obj.nonlinear_expr());
  EXPECT_EQ(0, obj.linear_expr().num_terms());

  p.AddObj(mp::obj::MAX, mp::NumericExpr());
  EXPECT_EQ(2, p.num_objs());
  obj = p.obj(1);
  EXPECT_EQ(mp::obj::MAX, obj.type());
  EXPECT_TRUE(!obj.nonlinear_expr());
  EXPECT_EQ(0, obj.linear_expr().num_terms());

  auto nl_expr = p.MakeNumericConstant(42);
  Problem::LinearObjBuilder builder = p.AddObj(mp::obj::MIN, nl_expr);
  builder.AddTerm(0, 1.1);
  builder.AddTerm(3, 2.2);
  EXPECT_EQ(3, p.num_objs());
  obj = p.obj(2);
  EXPECT_EQ(mp::obj::MIN, obj.type());
  const int indices[] = {0, 3};
  const double coefs[] = {1.1, 2.2};
  EXPECT_LINEAR_EXPR(obj.linear_expr(), indices, coefs);
}